

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_iterator_suite.cpp
# Opt level: O2

void concept_suite::run(void)

{
  iterator_swappable();
  iterator_dereferenceable();
  iterator_incrementable();
  input_iterator_equality_comparable();
  input_iterator_dereferenceable();
  input_iterator_post_incrementable();
  forward_iterator_default_constructible();
  forward_iterator_multipass();
  bidirectional_iterator_decrementable();
  bidirectional_iterator_post_decrementable();
  return;
}

Assistant:

void run()
{
    // [iterator.iterators]
    iterator_move_constructible();
    iterator_copy_constructible();
    iterator_copy_assignable();
    iterator_destructible();
    iterator_swappable();
    iterator_traits();
    iterator_dereferenceable();
    iterator_incrementable();

    // [input.iterators]
    input_iterator_equality_comparable();
    input_iterator_dereferenceable();
    input_iterator_post_incrementable();

    // [forward.iterators]
    forward_iterator_default_constructible();
    forward_iterator_multipass();

    // [bidirectional.iterators]
    bidirectional_iterator_decrementable();
    bidirectional_iterator_post_decrementable();
}